

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMTaskHandle INT_CMadd_periodic(CManager_conflict cm,long period,CMPollFunc func,void *client_data)

{
  CMTaskHandle __ptr;
  periodic_task_handle p_Var1;
  
  __ptr = (CMTaskHandle)INT_CMmalloc(0x10);
  if (cm->control_list->select_initialized == 0) {
    CM_init_select(cm->control_list,cm);
  }
  __ptr->cm = cm;
  p_Var1 = (*cm->control_list->add_periodic)
                     (&CMstatic_trans_svcs,&cm->control_list->select_data,0,(int)period,
                      (select_list_func)func,cm,client_data);
  __ptr->task = p_Var1;
  if (p_Var1 == (periodic_task_handle)0x0) {
    free(__ptr);
    __ptr = (CMTaskHandle)0x0;
  }
  return __ptr;
}

Assistant:

extern CMTaskHandle
 INT_CMadd_periodic(CManager cm, long period, CMPollFunc func,
		    void *client_data)
 {
     CMTaskHandle handle = INT_CMmalloc(sizeof(*handle));
     if (!cm->control_list->select_initialized) {
	 CM_init_select(cm->control_list, cm);
     }
     handle->cm = cm;
     handle->task = 
	 cm->control_list->add_periodic(&CMstatic_trans_svcs,
					&cm->control_list->select_data,
					0, period, (select_list_func)func, 
					(void*)cm, client_data);
     if (handle->task == NULL) {
	 free(handle);
	 return NULL;
     }
     return handle;
 }